

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O1

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationZ<std::complex<float>_>::matrix(RotationZ<std::complex<float>_> *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<float>_> SVar4;
  
  uVar2 = *(ulong *)(in_RSI + 0x10);
  uVar1 = *(ulong *)(in_RSI + 0x10);
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)0x2;
  puVar3 = (ulong *)operator_new__(0x20);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *(ulong **)
   &(this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.qubit_ =
       puVar3;
  *puVar3 = uVar2 ^ 0x8000000000000000;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = uVar1;
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using SqMat = qclab::dense::SquareMatrix< T > ;
          return SqMat( T(this->cos(),-this->sin()) , T(0) ,
                        T(0) , T(this->cos(), this->sin()) ) ;
        }